

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

RuntimeFunction * __thiscall
Js::JavascriptLibrary::EnsureAsyncFromSyncIteratorValueUnwrapTrueFunction(JavascriptLibrary *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  FunctionInfo *this_00;
  DynamicType *type;
  RuntimeFunction *pRVar5;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (((((this->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES2018AsyncIteration == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x195c,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pRVar5 = (this->asyncFromSyncIteratorValueUnwrapTrueFunction).ptr;
  if (pRVar5 == (RuntimeFunction *)0x0) {
    local_60 = (undefined1  [8])&FunctionInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x1960;
    pRVar4 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar4,0x37a1d4);
    FunctionInfo::FunctionInfo
              (this_00,JavascriptAsyncFromSyncIterator::
                       EntryAsyncFromSyncIteratorValueUnwrapTrueFunction,None,0xffffffff,
               (FunctionProxy *)0x0);
    type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                            &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                             super_RecyclableObject,
                            JavascriptAsyncFromSyncIterator::
                            EntryAsyncFromSyncIteratorValueUnwrapTrueFunction,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,false,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<false,false,false>,false,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&RuntimeFunction::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x1963;
    pRVar4 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pRVar5 = (RuntimeFunction *)
             new<(Memory::ObjectInfoBits)1>
                       (0x40,pRVar4,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27);
    RuntimeFunction::RuntimeFunction(pRVar5,type,this_00);
    Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierSet
              (&this->asyncFromSyncIteratorValueUnwrapTrueFunction,pRVar5);
    pRVar5 = (this->asyncFromSyncIteratorValueUnwrapTrueFunction).ptr;
  }
  return pRVar5;
}

Assistant:

RuntimeFunction* JavascriptLibrary::EnsureAsyncFromSyncIteratorValueUnwrapTrueFunction()
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());
        if (asyncFromSyncIteratorValueUnwrapTrueFunction == nullptr)
        {
            JavascriptMethod entryPoint = JavascriptAsyncFromSyncIterator::EntryAsyncFromSyncIteratorValueUnwrapTrueFunction;
            FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint);
            DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());

            asyncFromSyncIteratorValueUnwrapTrueFunction = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, RuntimeFunction, type, functionInfo);
        }

        return asyncFromSyncIteratorValueUnwrapTrueFunction;
    }